

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O0

void secp256k1_modinv32_update_fg_30_var
               (int len,secp256k1_modinv32_signed30 *f,secp256k1_modinv32_signed30 *g,
               secp256k1_modinv32_trans2x2 *t)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int in_EDI;
  int i;
  int64_t cg;
  int64_t cf;
  int32_t gi;
  int32_t fi;
  int32_t r;
  int32_t q;
  int32_t v;
  int32_t u;
  int32_t M30;
  int local_54;
  long local_50;
  long local_48;
  
  iVar1 = *in_RCX;
  iVar2 = in_RCX[1];
  iVar3 = in_RCX[2];
  iVar4 = in_RCX[3];
  if (in_EDI < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x1fb,"test condition failed: len > 0");
    abort();
  }
  uVar5 = (long)iVar1 * (long)*in_RSI + (long)iVar2 * (long)*in_RDX;
  uVar6 = (long)iVar3 * (long)*in_RSI + (long)iVar4 * (long)*in_RDX;
  if ((uVar5 & 0x3fffffff) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x202,"test condition failed: ((int32_t)cf & M30) == 0");
    abort();
  }
  if ((uVar6 & 0x3fffffff) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x203,"test condition failed: ((int32_t)cg & M30) == 0");
    abort();
  }
  for (local_54 = 1; local_48 = (long)uVar5 >> 0x1e, local_50 = (long)uVar6 >> 0x1e,
      local_54 < in_EDI; local_54 = local_54 + 1) {
    uVar5 = (long)iVar1 * (long)in_RSI[local_54] + (long)iVar2 * (long)in_RDX[local_54] + local_48;
    uVar6 = (long)iVar3 * (long)in_RSI[local_54] + (long)iVar4 * (long)in_RDX[local_54] + local_50;
    in_RSI[local_54 + -1] = (uint)uVar5 & 0x3fffffff;
    in_RDX[local_54 + -1] = (uint)uVar6 & 0x3fffffff;
  }
  in_RSI[in_EDI + -1] = (int)local_48;
  in_RDX[in_EDI + -1] = (int)local_50;
  return;
}

Assistant:

static void secp256k1_modinv32_update_fg_30_var(int len, secp256k1_modinv32_signed30 *f, secp256k1_modinv32_signed30 *g, const secp256k1_modinv32_trans2x2 *t) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    const int32_t u = t->u, v = t->v, q = t->q, r = t->r;
    int32_t fi, gi;
    int64_t cf, cg;
    int i;
    VERIFY_CHECK(len > 0);
    /* Start computing t*[f,g]. */
    fi = f->v[0];
    gi = g->v[0];
    cf = (int64_t)u * fi + (int64_t)v * gi;
    cg = (int64_t)q * fi + (int64_t)r * gi;
    /* Verify that the bottom 62 bits of the result are zero, and then throw them away. */
    VERIFY_CHECK(((int32_t)cf & M30) == 0); cf >>= 30;
    VERIFY_CHECK(((int32_t)cg & M30) == 0); cg >>= 30;
    /* Now iteratively compute limb i=1..len of t*[f,g], and store them in output limb i-1 (shifting
     * down by 30 bits). */
    for (i = 1; i < len; ++i) {
        fi = f->v[i];
        gi = g->v[i];
        cf += (int64_t)u * fi + (int64_t)v * gi;
        cg += (int64_t)q * fi + (int64_t)r * gi;
        f->v[i - 1] = (int32_t)cf & M30; cf >>= 30;
        g->v[i - 1] = (int32_t)cg & M30; cg >>= 30;
    }
    /* What remains is limb (len) of t*[f,g]; store it as output limb (len-1). */
    f->v[len - 1] = (int32_t)cf;
    g->v[len - 1] = (int32_t)cg;
}